

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_reader.inl
# Opt level: O2

buffer_reader * __thiscall
buffer_reader::operator>>
          (buffer_reader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  size_t i;
  ulong uVar1;
  buffer_collection_size size;
  uint32_t local_1c;
  
  local_1c = 0;
  operator>>(this,&local_1c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vector,(ulong)local_1c);
  for (uVar1 = 0; uVar1 < local_1c; uVar1 = uVar1 + 1) {
    operator>>(this,(vector->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + uVar1);
  }
  return this;
}

Assistant:

inline buffer_reader& buffer_reader::operator>>(std::vector<T>& vector)
{
    buffer_collection_size size = 0;
    *this >> size;
    vector.resize(size);

    for(std::size_t i = 0; i < size; ++i)
    {
        *this >> vector[i];
    }

    return *this;
}